

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_32::BinaryReaderOpcnt::OnEndFunc(BinaryReaderOpcnt *this)

{
  pair<std::_Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>,_bool> pVar1;
  _Head_base<0UL,_int,_false> local_c;
  _Tuple_impl<0UL,_wabt::Opcode::Enum,_wabt::OpcodeInfo::Kind> local_8;
  
  local_8.super__Tuple_impl<1UL,_wabt::OpcodeInfo::Kind>.
  super__Head_base<1UL,_wabt::OpcodeInfo::Kind,_false>._M_head_impl =
       (_Head_base<1UL,_wabt::OpcodeInfo::Kind,_false>)0x0;
  local_8.super__Head_base<0UL,_wabt::Opcode::Enum,_false>._M_head_impl = End;
  local_c._M_head_impl = 0;
  pVar1 = std::
          _Rb_tree<wabt::OpcodeInfo,std::pair<wabt::OpcodeInfo_const,unsigned_long>,std::_Select1st<std::pair<wabt::OpcodeInfo_const,unsigned_long>>,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
          ::
          _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<wabt::Opcode::Enum,wabt::OpcodeInfo::Kind>,std::tuple<int>>
                    ((_Rb_tree<wabt::OpcodeInfo,std::pair<wabt::OpcodeInfo_const,unsigned_long>,std::_Select1st<std::pair<wabt::OpcodeInfo_const,unsigned_long>>,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
                      *)this->opcode_counts_,(piecewise_construct_t *)&std::piecewise_construct,
                     (tuple<wabt::Opcode::Enum,_wabt::OpcodeInfo::Kind> *)&local_8,
                     (tuple<int> *)&local_c);
  *(long *)(pVar1.first._M_node._M_node + 2) = *(long *)(pVar1.first._M_node._M_node + 2) + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderOpcnt::OnEndFunc() {
  return Emplace(Opcode::End, OpcodeInfo::Kind::Bare);
}